

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_prevent_healing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    txt = "Their body is already deficient in healing ability.\n\r";
  }
  else {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
    if (!bVar1) {
      bVar1 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                      super__Vector_impl_data._M_start[*(short *)((long)vo + 0x136)].name,"troll");
      if (bVar1) {
        send_to_char("You feel your body losing it\'s ability to heal.\n\r",(CHAR_DATA *)vo);
        act("$n looks very sick.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        init_affect(&AStack_88);
        AStack_88.where = 0;
        AStack_88.aftype = 0;
        AStack_88.type = gsn_prevent_healing;
        AStack_88.location = 0;
        AStack_88.modifier = 0;
        AStack_88.duration = (short)(level / 6);
        AStack_88.mod_name = 0xf;
        AStack_88.level = (short)level;
        affect_to_char((CHAR_DATA *)vo,&AStack_88);
        return;
      }
    }
    txt = "Spell failed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_prevent_healing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("Their body is already deficient in healing ability.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER) || !str_cmp(race_table[victim->race].name, "troll"))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	send_to_char("You feel your body losing it's ability to heal.\n\r", victim);
	act("$n looks very sick.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_prevent_healing;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 6;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);
}